

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

void srunner_add_failure(SRunner *sr,TestResult *tr)

{
  int *piVar1;
  TestStats *pTVar2;
  long lVar3;
  
  check_list_add_end(sr->resultlst,tr);
  pTVar2 = sr->stats;
  pTVar2->n_checked = pTVar2->n_checked + 1;
  if (tr->rtype == CK_FAILURE) {
    lVar3 = 4;
  }
  else {
    if (tr->rtype != CK_ERROR) {
      return;
    }
    lVar3 = 8;
  }
  piVar1 = (int *)((long)&pTVar2->n_checked + lVar3);
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

static void srunner_add_failure(SRunner * sr, TestResult * tr)
{
    check_list_add_end(sr->resultlst, tr);
    sr->stats->n_checked++;     /* count checks during setup, test, and teardown */
    if(tr->rtype == CK_FAILURE)
        sr->stats->n_failed++;
    else if(tr->rtype == CK_ERROR)
        sr->stats->n_errors++;

}